

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalNinjaGenerator::GetEncodedLiteral
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *lit)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  string result;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (lit->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + lit->_M_string_length);
  iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x3c])(this,(string *)local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,
             ((long *)CONCAT44(extraout_var,iVar3))[1] + lVar2);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::GetEncodedLiteral(const std::string& lit)
{
  std::string result = lit;
  return this->EncodeLiteral(result);
}